

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_freeDCtx(ZSTD_DCtx *dctx)

{
  ZSTD_customMem *pZVar1;
  ZSTD_DDictHashSet *ptr;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  ZSTD_customMem customMem_02;
  size_t sVar2;
  ZSTD_customMem cMem;
  
  if (dctx != (ZSTD_DCtx *)0x0) {
    if (dctx->staticSize == 0) {
      pZVar1 = &dctx->customMem;
      customMem_02 = *pZVar1;
      customMem_01 = *pZVar1;
      customMem_00 = *pZVar1;
      customMem = *pZVar1;
      ZSTD_clearDict(dctx);
      ZSTD_customFree(dctx->inBuff,customMem);
      dctx->inBuff = (char *)0x0;
      ptr = dctx->ddictSet;
      if (ptr != (ZSTD_DDictHashSet *)0x0) {
        if (ptr->ddictPtrTable != (ZSTD_DDict **)0x0) {
          ZSTD_customFree(ptr->ddictPtrTable,customMem_00);
        }
        ZSTD_customFree(ptr,customMem_01);
        dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
      }
      ZSTD_customFree(dctx,customMem_02);
      sVar2 = 0;
    }
    else {
      sVar2 = 0xffffffffffffffc0;
    }
    return sVar2;
  }
  return 0;
}

Assistant:

size_t ZSTD_freeDCtx(ZSTD_DCtx* dctx)
{
    if (dctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(dctx->staticSize, memory_allocation, "not compatible with static DCtx");
    {   ZSTD_customMem const cMem = dctx->customMem;
        ZSTD_clearDict(dctx);
        ZSTD_customFree(dctx->inBuff, cMem);
        dctx->inBuff = NULL;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (dctx->legacyContext)
            ZSTD_freeLegacyStreamContext(dctx->legacyContext, dctx->previousLegacyVersion);
#endif
        if (dctx->ddictSet) {
            ZSTD_freeDDictHashSet(dctx->ddictSet, cMem);
            dctx->ddictSet = NULL;
        }
        ZSTD_customFree(dctx, cMem);
        return 0;
    }
}